

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O3

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Box_Tessellation
          (Triangulated_Surface<float> *this,Box<float,_3> *box)

{
  Simplex_Mesh<3> *this_00;
  undefined8 uVar1;
  pointer pVVar2;
  pointer pVVar3;
  TV local_40;
  
  pVVar2 = (this->super_Point_Cloud<float,_3>).points._data.
           super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->super_Point_Cloud<float,_3>).points._data.
    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar3 = (this->super_Simplex_Mesh<3>).elements._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (this->super_Simplex_Mesh<3>).elements._data.
    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  this_00 = &this->super_Simplex_Mesh<3>;
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).max_corner._data._M_elems[2];
  uVar1 = *(undefined8 *)(box->super_Range<float,_3>).min_corner._data._M_elems;
  local_40._data._M_elems[0] = (float)uVar1;
  local_40._data._M_elems[1] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[1] = (box->super_Range<float,_3>).min_corner._data._M_elems[1];
  local_40._data._M_elems[0] = (box->super_Range<float,_3>).max_corner._data._M_elems[0];
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).max_corner._data._M_elems[2];
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).max_corner._data._M_elems[2];
  uVar1 = *(undefined8 *)(box->super_Range<float,_3>).max_corner._data._M_elems;
  local_40._data._M_elems[0] = (float)uVar1;
  local_40._data._M_elems[1] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[0] = (box->super_Range<float,_3>).min_corner._data._M_elems[0];
  uVar1 = *(undefined8 *)((box->super_Range<float,_3>).max_corner._data._M_elems + 1);
  local_40._data._M_elems[1] = (float)uVar1;
  local_40._data._M_elems[2] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).min_corner._data._M_elems[2];
  uVar1 = *(undefined8 *)(box->super_Range<float,_3>).min_corner._data._M_elems;
  local_40._data._M_elems[0] = (float)uVar1;
  local_40._data._M_elems[1] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[0] = (box->super_Range<float,_3>).max_corner._data._M_elems[0];
  uVar1 = *(undefined8 *)((box->super_Range<float,_3>).min_corner._data._M_elems + 1);
  local_40._data._M_elems[1] = (float)uVar1;
  local_40._data._M_elems[2] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).min_corner._data._M_elems[2];
  uVar1 = *(undefined8 *)(box->super_Range<float,_3>).max_corner._data._M_elems;
  local_40._data._M_elems[0] = (float)uVar1;
  local_40._data._M_elems[1] = (float)((ulong)uVar1 >> 0x20);
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[1] = (box->super_Range<float,_3>).max_corner._data._M_elems[1];
  local_40._data._M_elems[0] = (box->super_Range<float,_3>).min_corner._data._M_elems[0];
  local_40._data._M_elems[2] = (box->super_Range<float,_3>).min_corner._data._M_elems[2];
  Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&local_40);
  local_40._data._M_elems[0] = 0.0;
  local_40._data._M_elems[1] = 4.2039e-45;
  local_40._data._M_elems[2] = 9.80909e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 9.80909e-45;
  local_40._data._M_elems[1] = 5.60519e-45;
  local_40._data._M_elems[2] = 0.0;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 1.4013e-45;
  local_40._data._M_elems[1] = 7.00649e-45;
  local_40._data._M_elems[2] = 8.40779e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 8.40779e-45;
  local_40._data._M_elems[1] = 2.8026e-45;
  local_40._data._M_elems[2] = 1.4013e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 5.60519e-45;
  local_40._data._M_elems[1] = 1.4013e-45;
  local_40._data._M_elems[2] = 0.0;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 1.4013e-45;
  local_40._data._M_elems[1] = 5.60519e-45;
  local_40._data._M_elems[2] = 7.00649e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 8.40779e-45;
  local_40._data._M_elems[1] = 9.80909e-45;
  local_40._data._M_elems[2] = 2.8026e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 4.2039e-45;
  local_40._data._M_elems[1] = 2.8026e-45;
  local_40._data._M_elems[2] = 9.80909e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 5.60519e-45;
  local_40._data._M_elems[1] = 9.80909e-45;
  local_40._data._M_elems[2] = 8.40779e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 8.40779e-45;
  local_40._data._M_elems[1] = 7.00649e-45;
  local_40._data._M_elems[2] = 5.60519e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 0.0;
  local_40._data._M_elems[1] = 1.4013e-45;
  local_40._data._M_elems[2] = 2.8026e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  local_40._data._M_elems[0] = 0.0;
  local_40._data._M_elems[1] = 2.8026e-45;
  local_40._data._M_elems[2] = 4.2039e-45;
  Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&local_40);
  (this->super_Simplex_Mesh<3>).number_of_nodes =
       ((long)(this->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Box_Tessellation(const Box<T,d>& box)
{
    points.Clear();elements.Clear();

    Add_Vertex(TV({box.min_corner[0],box.min_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.min_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.max_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.max_corner[1],box.max_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.min_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.min_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.max_corner[0],box.max_corner[1],box.min_corner[2]}));
    Add_Vertex(TV({box.min_corner[0],box.max_corner[1],box.min_corner[2]}));

    Add_Element(INDEX({0,3,7}));
    Add_Element(INDEX({7,4,0}));
    Add_Element(INDEX({1,5,6}));
    Add_Element(INDEX({6,2,1}));
    Add_Element(INDEX({4,1,0}));
    Add_Element(INDEX({1,4,5}));
    Add_Element(INDEX({6,7,2}));
    Add_Element(INDEX({3,2,7}));
    Add_Element(INDEX({4,7,6}));
    Add_Element(INDEX({6,5,4}));
    Add_Element(INDEX({0,1,2}));
    Add_Element(INDEX({0,2,3}));
    number_of_nodes=points.size();
}